

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemsemaphore_posix.cpp
# Opt level: O3

bool __thiscall
QSystemSemaphorePosix::modifySemaphore
          (QSystemSemaphorePosix *this,QSystemSemaphorePrivate *self,int count)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  bool bVar4;
  int iVar5;
  long in_FS_OFFSET;
  QLatin1StringView function;
  QLatin1StringView function_00;
  QString local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = false;
  bVar1 = handle(this,self,Open);
  if (bVar1) {
    iVar5 = count;
    if (count < 1) {
      bVar4 = false;
      do {
        do {
          iVar5 = sem_wait((sem_t *)this->semaphore);
          if (iVar5 != -1) goto LAB_0049ad07;
          piVar3 = __errno_location();
          iVar5 = *piVar3;
        } while (iVar5 == 4);
        if ((iVar5 != 0x2b) && (iVar5 != 0x16)) {
          function_00.m_data = "QSystemSemaphore::modifySemaphore (sem_wait)";
          function_00.m_size = 0x2c;
          QSystemSemaphorePrivate::setUnixErrorString(self,function_00);
          goto LAB_0049ade5;
        }
        this->semaphore = (sem_t *)0x0;
        bVar1 = handle(this,self,Open);
      } while (bVar1);
    }
    else {
      do {
        iVar2 = sem_post((sem_t *)this->semaphore);
        if (iVar2 == -1) {
          function.m_data = "QSystemSemaphore::modifySemaphore (sem_post)";
          function.m_size = 0x2c;
          QSystemSemaphorePrivate::setUnixErrorString(self,function);
          if (count <= iVar5) goto LAB_0049ade5;
          goto LAB_0049adb0;
        }
        bVar1 = 1 < iVar5;
        iVar5 = iVar5 + -1;
      } while (bVar1);
LAB_0049ad07:
      local_48.d.d = (Data *)0x0;
      local_48.d.ptr = (char16_t *)0x0;
      local_48.d.size = 0;
      self->error = NoError;
      QString::operator=(&self->errorString,&local_48);
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
        }
      }
      bVar4 = true;
    }
  }
  goto LAB_0049ade8;
LAB_0049adb0:
  do {
    iVar2 = sem_wait((sem_t *)this->semaphore);
    if (iVar2 == -1) {
      piVar3 = __errno_location();
      if (*piVar3 == 4) goto LAB_0049adb0;
    }
    iVar5 = iVar5 + 1;
  } while (iVar5 != count);
LAB_0049ade5:
  bVar4 = false;
LAB_0049ade8:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool QSystemSemaphorePosix::modifySemaphore(QSystemSemaphorePrivate *self, int count)
{
    if (!handle(self, QSystemSemaphore::Open))
        return false;

    if (count > 0) {
        int cnt = count;
        do {
            if (::sem_post(semaphore) == -1) {
#if defined(Q_OS_VXWORKS)
                if (errno == EINVAL) {
                    semaphore = SEM_FAILED;
                    return modifySemaphore(self, cnt);
                }
#endif
                self->setUnixErrorString("QSystemSemaphore::modifySemaphore (sem_post)"_L1);
#if defined QSYSTEMSEMAPHORE_DEBUG
                qDebug("QSystemSemaphorePosix::modify sem_post failed %d %d", count, errno);
#endif
                // rollback changes to preserve the SysV semaphore behavior
                for ( ; cnt < count; ++cnt) {
                    int res;
                    QT_EINTR_LOOP(res, ::sem_wait(semaphore));
                }
                return false;
            }
            --cnt;
        } while (cnt > 0);
    } else {
        int res;
        QT_EINTR_LOOP(res, ::sem_wait(semaphore));
        if (res == -1) {
            // If the semaphore was removed be nice and create it and then modifySemaphore again
            if (errno == EINVAL || errno == EIDRM) {
                semaphore = SEM_FAILED;
                return modifySemaphore(self, count);
            }
            self->setUnixErrorString("QSystemSemaphore::modifySemaphore (sem_wait)"_L1);
#if defined QSYSTEMSEMAPHORE_DEBUG
            qDebug("QSystemSemaphorePosix::modify sem_wait failed %d %d", count, errno);
#endif
            return false;
        }
    }

    self->clearError();
    return true;
}